

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O0

void __thiscall
TaprootScriptTree_TreeTest2_Test::~TaprootScriptTree_TreeTest2_Test
          (TaprootScriptTree_TreeTest2_Test *this)

{
  TaprootScriptTree_TreeTest2_Test *this_local;
  
  ~TaprootScriptTree_TreeTest2_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(TaprootScriptTree, TreeTest2) {
  //        /\        //
  //       /\ H       //
  //      /  \        //
  //     /\  /\       //
  //    /  D E \      //
  //   / \     /\     //
  //  A   /\  F  G    //
  //     B  C         //
  Privkey key("dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8");
  ByteData256 tweak1("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  ByteData256 tweak2("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57");
  ByteData256 tweak3("a78120a2d338fce91a49230935e8f000672f9511ee6fa5fc35ef22f0dfc89475");
  ByteData256 tweak4("4b79048979258d39c31b10f2bda70a433daa6e42f987089053f00db1d0f94a8e");
  Pubkey pubkey1 = key.GeneratePubkey();
  Pubkey pubkey2 = pubkey1 + tweak3;
  Pubkey pubkey3 = pubkey1 + tweak4;
  SchnorrPubkey schnorr_pubkey1 = SchnorrPubkey::FromPubkey(pubkey1);
  SchnorrPubkey schnorr_pubkey11 = schnorr_pubkey1 + tweak1;
  SchnorrPubkey schnorr_pubkey12 = schnorr_pubkey1 + tweak2;
  SchnorrPubkey schnorr_pubkey2 = SchnorrPubkey::FromPubkey(pubkey2);
  SchnorrPubkey schnorr_pubkey21 = schnorr_pubkey2 + tweak1;
  SchnorrPubkey schnorr_pubkey22 = schnorr_pubkey2 + tweak2;
  SchnorrPubkey schnorr_pubkey3 = SchnorrPubkey::FromPubkey(pubkey3);
  SchnorrPubkey schnorr_pubkey31 = schnorr_pubkey3 + tweak1;
  SchnorrPubkey schnorr_pubkey32 = schnorr_pubkey3 + tweak2;

  Script script_a = (ScriptBuilder() << schnorr_pubkey1.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_b = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  Script script_c = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_d = (ScriptBuilder() << schnorr_pubkey11.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey12.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  // Script script_e = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  Script script_e = (ScriptBuilder() << schnorr_pubkey2.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_f = (ScriptBuilder() << schnorr_pubkey21.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_g = (ScriptBuilder() << schnorr_pubkey22.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  // <pubkey_1> CHECKSIGVERIFY ... <pubkey_(n-1)> CHECKSIGVERIFY <pubkey_n> CHECKSIG
  Script script_h = (ScriptBuilder() << schnorr_pubkey31.GetData()
      << ScriptOperator::OP_CHECKSIGVERIFY << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  Script script_j = (ScriptBuilder() << schnorr_pubkey32.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();

  EXPECT_EQ("20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac", script_a.GetHex());
  EXPECT_EQ("51", script_b.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac", script_c.GetHex());
  EXPECT_EQ("2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac", script_d.GetHex());
  EXPECT_EQ("20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac", script_e.GetHex());
  EXPECT_EQ("2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac", script_f.GetHex());
  EXPECT_EQ("204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac", script_g.GetHex());
  EXPECT_EQ("2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_h.GetHex());
  EXPECT_EQ("20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac", script_j.GetHex());

  struct TestScriptTree2Data {
    std::string name;
    Script script;
    size_t depth;
    std::string nodes;
  };
  std::vector<TestScriptTree2Data> exp_list = {
    {
      "a", script_a, 4,
      "4b3bb79ea92e0b4f2bfa7e8c88d81133e347da393d72a37fe9cdcf1f5f56b5e0e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "b", script_b, 5,
      "06b46c960d6824f0da5af71d9ecc55714de5b2d2da51be60bd12c77df20a20df4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "c", script_c, 5,
      "a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d6754691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fde47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb0db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "d", script_d, 3,
      "7da36533760cede4c164d5c00eb1500a27dd86ca76914a9874112c43e0c1b9450db59f44e1394f15d0f0332e106865849b6dff25aa6a9bf7fe82362d7637be55d7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "e", script_e, 3,
      "aaf9ea4cbd2f4606a31a35d563fa371bc630d9d7bcc50f62d064a3d84e0e3086aeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "f", script_f, 4,
      "1aac269b1edaa45c69fb8d1a703a1bb69e90129cef7b7cfe9e676b28e6d1175d7f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "g", script_g, 4,
      "e82da59bb829eb21f7cb8eb9eb128626da9a9a31f3dfdeb29766faf14468e9967f0ebfee6d06410937c4fd9284a322d1ca33bd1dc315a04e44c4b7df65cfccffaeeaab89d953f80ff117b3a94142c859f885c2d942ec13536f72dac0c961f27ed7b0b8d070638ff4f0b7e7d2aa930c58ec2d39853fd04c29c4c6688fdcb2ae75"
    },
    {
      "h", script_h, 1, "8f43855f8d9916a2cece54e67b4ce08950a60cc3cce8907d34e03788ade5a977"
    },
  };

  auto exp_hash = "ca0e12942fdb00ad71e84e02c44c0b9136e60ff2c25bcb3cade4d7dc53d246df";
  auto exp_str = "{{{tl(20a6573124a479ab188b063bc383aa599da8ccc3b8f90fc18d570a8b367276eaf5ac),{tl(204a7af8660f2b0bdb92d2ce8b88ab30feb916343228d2e7bd15da02e1f6a31d47ac),tl(2000d134c42fd51c90fa82c6cfdaabd895474d979118525362c0cd236c857e29d9ac)}},{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),{tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aac),tl(51)}},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}},tl(2008f8280d68e02e807ccffee141c4a6b7ac31d3c283ae0921892d95f691742c44ad20b0f8ce3e1df406514a773414b5d9e5779d8e68ce816e9db39b8e53255ac3b406ac)}";
  TaprootScriptTree tree_efg(script_f);
  tree_efg.AddBranch(TaprootScriptTree(script_g));
  tree_efg.AddBranch(TaprootScriptTree(script_e));

  TaprootScriptTree tree_b(script_b);
  tree_b.AddBranch(TaprootScriptTree(script_c));
  tree_b.AddBranch(TaprootScriptTree(script_a));
  tree_b.AddBranch(TaprootScriptTree(script_d));
  tree_b.AddBranch(tree_efg);
  tree_b.AddBranch(TaprootScriptTree(script_h));

  TaprootScriptTree tree = tree_b;
  EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ(exp_str, tree.ToString());

  for (const auto& test_data : exp_list) {
    SCOPED_TRACE("script_" + test_data.name);
    tree = TaprootScriptTree::FromString(exp_str, test_data.script);
    EXPECT_EQ(exp_hash, tree.GetCurrentBranchHash().GetHex());
    EXPECT_EQ(exp_str, tree.ToString());
    EXPECT_EQ(test_data.script.GetHex(), tree.GetScript().GetHex());
    EXPECT_EQ(test_data.depth, tree.GetBranchList().size());
    std::string nodes;
    for (const auto& node : tree.GetNodeList()) nodes += node.GetHex();
    EXPECT_EQ(test_data.nodes, nodes);
  }

  // invalid leaf
  try {
    tree = TaprootScriptTree::FromString(exp_str, script_j);
    EXPECT_EQ("xxx", tree.GetScript().GetHex());
    EXPECT_EQ("xxx", script_j.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ(
      "This tapscript not exist in this tree.",
      except.what());
  }
}